

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigIntTest.hpp
# Opt level: O0

void Qentem::Test::PrintDigits<Qentem::BigInt<unsigned_long_long,1024u>>
               (BigInt<unsigned_long_long,_1024U> *b_int,StringStream<char> *stream)

{
  uint local_15c;
  char local_158 [4];
  uint index;
  char storage [309];
  uint max;
  StringStream<char> *stream_local;
  BigInt<unsigned_long_long,_1024U> *b_int_local;
  
  stack0xffffffffffffffe4 = 0x135;
  memset(local_158,0,0x135);
  local_15c = 0;
  StreamDigits<Qentem::BigInt<unsigned_long_long,1024u>>(local_158,&local_15c,b_int);
  StringStream<char>::Clear(stream);
  while (local_15c != 0) {
    local_15c = local_15c - 1;
    operator<<(stream,local_158[local_15c]);
  }
  return;
}

Assistant:

static void PrintDigits(BigInt_T b_int, StringStream<char> &stream) {
    constexpr unsigned int max = (((b_int.TotalBits() * 30103U) / 100000U) + 1U);
    char                   storage[max]{0};
    unsigned int           index = 0;

    StreamDigits(&(storage[0]), index, b_int);

    stream.Clear();

    while (index != 0) {
        --index;
        stream << storage[index];
    }
}